

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O0

Promise<kj::AsyncCapabilityStream::ReadResult> __thiscall
kj::anon_unknown_123::AsyncPipe::AbortedRead::tryReadWithFds
          (AbortedRead *this,void *readBuffer,size_t minBytes,size_t maxBytes,OwnFd *fdBuffer,
          size_t maxFds)

{
  String local_1e0;
  Exception local_1c8;
  size_t local_38;
  OwnFd *fdBuffer_local;
  size_t maxBytes_local;
  size_t minBytes_local;
  void *readBuffer_local;
  AbortedRead *this_local;
  
  local_38 = maxFds;
  fdBuffer_local = fdBuffer;
  maxBytes_local = maxBytes;
  minBytes_local = minBytes;
  readBuffer_local = readBuffer;
  this_local = this;
  kj::_::Debug::makeDescription<char_const(&)[28]>
            (&local_1e0,(Debug *)"\"abortRead() has been called\"","abortRead() has been called",
             (char (*) [28])maxBytes);
  Exception::Exception
            (&local_1c8,DISCONNECTED,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++"
             ,0x58c,&local_1e0);
  Promise<kj::AsyncCapabilityStream::ReadResult>::Promise
            ((Promise<kj::AsyncCapabilityStream::ReadResult> *)this,&local_1c8);
  Exception::~Exception(&local_1c8);
  String::~String(&local_1e0);
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

Promise<ReadResult> tryReadWithFds(void* readBuffer, size_t minBytes, size_t maxBytes,
                                       OwnFd* fdBuffer, size_t maxFds) override {
      return KJ_EXCEPTION(DISCONNECTED, "abortRead() has been called");
    }